

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_convert.cpp
# Opt level: O2

void __thiscall tst_qpromise_convert::fulfillTAsU(tst_qpromise_convert *this)

{
  QSharedData *pQVar1;
  QVector<Handler> *pQVar2;
  qsizetype *pqVar3;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **pppVar4;
  Data *pDVar5;
  long lVar6;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar7;
  undefined8 uVar8;
  Enum2 EVar9;
  PromiseResolver<void> PVar10;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<(anonymous_namespace)::Bar>_> QVar11;
  char16_t *pcVar12;
  Enum1 EVar13;
  char cVar14;
  bool bVar15;
  int iVar16;
  PromiseData<(anonymous_namespace)::Bar> *pPVar17;
  undefined8 *puVar18;
  PromiseData<(anonymous_namespace)::Bar> *pPVar19;
  char *pcVar20;
  char *pcVar21;
  Data *pDVar22;
  PromiseDataBase<QString,_void_(const_QString_&)> *this_00;
  QThread *pQVar23;
  qsizetype qVar24;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar25;
  PromiseData<QString> *this_01;
  qsizetype qVar26;
  _func_int **pp_Var27;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *old;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar28;
  PromiseData<(anonymous_namespace)::Bar> *pPVar29;
  qsizetype extraout_RDX;
  qsizetype extraout_RDX_00;
  qsizetype extraout_RDX_01;
  qsizetype extraout_RDX_02;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar30;
  QPromiseBase<int> *this_02;
  QPromiseBase<QString> *this_03;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar31;
  long lVar32;
  long lVar33;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *this_04;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar34;
  _Any_data local_338;
  undefined1 local_328 [40];
  PromiseResolver<void> resolver_8;
  undefined1 local_2f8 [16];
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *local_2e8;
  code *local_2e0;
  Enum2 value_1;
  uint uStack_2cc;
  PromiseResolver<void> resolver_3;
  undefined8 uStack_2c0;
  PromiseResolver<double> resolver;
  undefined1 local_298 [16];
  QPromise<(anonymous_namespace)::Bar> p_5;
  QPromise<int> p;
  QPromise<QString> p_6;
  QArrayDataPointer<char16_t> local_230;
  PromiseResolver<int> resolver_1;
  undefined **local_1f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_1f0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_1e8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_1e0;
  PromiseResolver<void> resolver_5;
  _Any_data local_1b8;
  undefined1 local_1a8 [16];
  QWriteLocker lock;
  Bar value_2;
  undefined4 uStack_164;
  Enum1 value;
  undefined8 uStack_150;
  _Manager_type local_148;
  _Invoker_type p_Stack_140;
  QWriteLocker lock_1;
  QWriteLocker lock_3;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  PromiseData<(anonymous_namespace)::Bar> *local_108;
  Foo local_fc;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  lock.q_val = 0x404510a3d70a3d71;
  local_2f8._0_8_ = &PTR__QPromiseBase_001480e0;
  pPVar17 = (PromiseData<(anonymous_namespace)::Bar> *)operator_new(0x68);
  ((PromiseDataBase<double,_void_(const_double_&)> *)
  &pPVar17->
   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<double,_void_(const_double_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    super_QSharedData = 0;
  *(undefined8 *)
   &((PromiseDataBase<double,_void_(const_double_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<double,_void_(const_double_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_settled = 0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.size = 0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.size = 0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_error).m_data._M_exception_object = (void *)0x0;
  (pPVar17->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar17->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<double>::PromiseData((PromiseData<double> *)pPVar17);
  LOCK();
  pQVar1 = &((PromiseDataBase<double,_void_(const_double_&)> *)
            &pPVar17->
             super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
            )->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar17 != (PromiseData<(anonymous_namespace)::Bar> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<double,_void_(const_double_&)> *)
              &pPVar17->
               super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              )->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_338._M_unused._M_object = &PTR__QPromiseBase_00148230;
  local_338._8_8_ = pPVar17;
  local_2f8._8_8_ = pPVar17;
  QtPromisePrivate::PromiseResolver<double>::PromiseResolver
            (&resolver,(QPromise<double> *)&local_338);
  QtPromise::QPromiseBase<double>::~QPromiseBase((QPromiseBase<double> *)&local_338);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver_3.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    resolver_3.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)resolver;
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  if (resolver_3.m_d.d == (Data *)0x0) {
    resolver_5.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver_3.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_3.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    resolver_5.m_d.d = resolver_3.m_d.d;
  }
  local_1b8._M_unused._M_object = (void *)0x0;
  QtPromisePrivate::PromiseResolver<double>::resolve<double>
            ((PromiseResolver<double> *)&resolver_3,(double *)&lock);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data> *)
             &resolver_5);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data> *)
             &local_1b8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data> *)
             &resolver_3);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_2f8._0_8_ = &PTR__QPromiseBase_00148230;
  QtPromise::QPromise<double>::convert<int>((QPromise<double> *)&p);
  QtPromise::QPromiseBase<double>::~QPromiseBase((QPromiseBase<double> *)local_2f8);
  local_338._0_4_ = 0xffffffff;
  iVar16 = waitForValue<int>(&p,(int *)local_338._M_pod_data);
  cVar14 = QTest::qCompare(iVar16,0x2a,"waitForValue(p, -1)","42",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x4f);
  if (cVar14 == '\0') {
    this_02 = &p.super_QPromiseBase<int>;
LAB_00108c99:
    QtPromise::QPromiseBase<int>::~QPromiseBase(this_02);
    return;
  }
  bVar15 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                     (&(p.super_QPromiseBase<int>.m_d.d)->
                       super_PromiseDataBase<int,_void_(const_int_&)>);
  cVar14 = QTest::qVerify(bVar15,"p.isFulfilled()","",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                          ,0x50);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  if (cVar14 == '\0') {
    return;
  }
  local_128._0_4_ = 1;
  QtPromise::resolve<(anonymous_namespace)::Enum1>
            ((QtPromise *)&resolver_3,(Enum1 *)local_128._M_pod_data);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_00148110;
  pPVar17 = (PromiseData<(anonymous_namespace)::Bar> *)operator_new(0x68);
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_error).m_data._M_exception_object = (void *)0x0;
  (pPVar17->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.size = 0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.size = 0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<double,_void_(const_double_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<double,_void_(const_double_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_settled = 0;
  ((PromiseDataBase<double,_void_(const_double_&)> *)
  &pPVar17->
   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<double,_void_(const_double_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    super_QSharedData = 0;
  (pPVar17->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData((PromiseData<int> *)pPVar17);
  LOCK();
  pQVar1 = &((PromiseDataBase<double,_void_(const_double_&)> *)
            &pPVar17->
             super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
            )->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar17 != (PromiseData<(anonymous_namespace)::Bar> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<double,_void_(const_double_&)> *)
              &pPVar17->
               super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              )->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2f8._0_8_ = &PTR__QPromiseBase_00148390;
  local_2f8._8_8_ = pPVar17;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)local_2f8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)local_2f8);
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_338._M_unused._M_object = (PromiseData<double> *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_338._M_unused._0_8_ = (undefined8)resolver_1;
  }
  local_1b8._M_unused._M_object = (void *)0x0;
  if ((PromiseData<double> *)local_338._M_unused._0_8_ == (PromiseData<double> *)0x0) {
    local_338._8_8_ = (PromiseData<double> *)0x0;
  }
  else {
    LOCK();
    *(int *)&((PromiseDataBase<double,_void_(const_double_&)> *)
             &((Data *)local_338._M_unused._0_8_)->super_QSharedData)->_vptr_PromiseDataBase =
         *(int *)&((PromiseDataBase<double,_void_(const_double_&)> *)
                  &((Data *)local_338._M_unused._0_8_)->super_QSharedData)->_vptr_PromiseDataBase +
         1;
    UNLOCK();
    local_338._8_8_ = local_338._M_unused._M_function_pointer;
  }
  _value = (Data *)0x0;
  if ((PromiseData<double> *)local_338._M_unused._0_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)&((PromiseDataBase<double,_void_(const_double_&)> *)
             &((Data *)local_338._M_unused._0_8_)->super_QSharedData)->_vptr_PromiseDataBase =
         *(int *)&((PromiseDataBase<double,_void_(const_double_&)> *)
                  &((Data *)local_338._M_unused._0_8_)->super_QSharedData)->_vptr_PromiseDataBase +
         1;
    UNLOCK();
  }
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)&(((PromiseData<double> *)local_338._8_8_)->
             super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase =
         *(int *)&(((PromiseData<double> *)local_338._8_8_)->
                  super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase + 1;
    UNLOCK();
  }
  resolver_5.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       local_338._M_unused._0_8_;
  lock.q_val = local_338._8_8_;
  std::function<int_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<int_(const_(anonymous_namespace)::Enum1_&)> *)local_328,
             (function<int_(const_(anonymous_namespace)::Enum1_&)> *)&p);
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  puVar18 = (undefined8 *)operator_new(0x30);
  *puVar18 = local_338._M_unused._M_object;
  if ((PromiseData<double> *)local_338._M_unused._0_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  puVar18[1] = local_338._8_8_;
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_338._8_8_ = *(int *)local_338._8_8_ + 1;
    UNLOCK();
  }
  std::function<int_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<int_(const_(anonymous_namespace)::Enum1_&)> *)(puVar18 + 2),
             (function<int_(const_(anonymous_namespace)::Enum1_&)> *)local_328);
  pcStack_c0 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  local_d8._M_unused._M_object = puVar18;
  QtPromisePrivate::
  PromiseHandler<(anonymous_namespace)::Enum1,std::function<int((anonymous_namespace)::Enum1_const&)>,(anonymous_namespace)::Enum1_const&>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(std::function<int((anonymous_namespace)::Enum1_const&)>const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda((anonymous_namespace)::Enum1_const&)#1}::~create
            ((_lambda__anonymous_namespace___Enum1_const___1_ *)&local_338);
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addHandler((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uStack_2c0,(function<void_(const_(anonymous_namespace)::Enum1_&)> *)&local_d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  local_338._M_unused._M_object = (void *)lock.q_val;
  if (lock.q_val != 0) {
    LOCK();
    *(int *)lock.q_val = *(int *)lock.q_val + 1;
    UNLOCK();
  }
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(8);
  *(void **)local_f8._M_unused._0_8_ = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  pcStack_e0 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
             ::_M_manager;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &local_338);
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addCatcher((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uStack_2c0,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&lock);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&value);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &resolver_5);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &local_1b8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_00148390;
  bVar15 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                        *)uStack_2c0);
  if (!bVar15) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uStack_2c0);
  }
  std::_Function_base::~_Function_base((_Function_base *)&p);
  QtPromise::QPromiseBase<(anonymous_namespace)::Enum1>::~QPromiseBase
            ((QPromiseBase<(anonymous_namespace)::Enum1> *)&resolver_3);
  local_338._0_4_ = 0xffffffff;
  iVar16 = waitForValue<int>((QPromise<int> *)&resolver,(int *)local_338._M_pod_data);
  cVar14 = QTest::qCompare(iVar16,1,"waitForValue(p, -1)","1",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x59);
  if (cVar14 == '\0') {
    this_02 = (QPromiseBase<int> *)&resolver;
    goto LAB_00108c99;
  }
  bVar15 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                     ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar17);
  cVar14 = QTest::qVerify(bVar15,"p.isFulfilled()","",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                          ,0x5a);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver);
  if (cVar14 == '\0') {
    return;
  }
  local_128._0_4_ = 1;
  QtPromise::resolve<int>((QtPromise *)&resolver_3,(int *)local_128._M_pod_data);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_00147310;
  pPVar17 = (PromiseData<(anonymous_namespace)::Bar> *)operator_new(0x68);
  (((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_error).m_data._M_exception_object = (void *)0x0;
  (pPVar17->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.size = 0;
  (((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.size = 0;
  (((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_settled = 0;
  ((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
  &pPVar17->
   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    super_QSharedData = 0;
  (pPVar17->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<(anonymous_namespace)::Enum1>::PromiseData
            ((PromiseData<(anonymous_namespace)::Enum1> *)pPVar17);
  LOCK();
  pQVar1 = &((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)&pPVar17->
                 super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
            )->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar17 != (PromiseData<(anonymous_namespace)::Bar> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                *)&pPVar17->
                   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              )->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2f8._0_8_ = &PTR__QPromiseBase_001475a0;
  local_2f8._8_8_ = pPVar17;
  QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::PromiseResolver
            ((PromiseResolver<(anonymous_namespace)::Enum1> *)&resolver_1,
             (QPromise<(anonymous_namespace)::Enum1> *)local_2f8);
  QtPromise::QPromiseBase<(anonymous_namespace)::Enum1>::~QPromiseBase
            ((QPromiseBase<(anonymous_namespace)::Enum1> *)local_2f8);
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_338._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_338._M_unused._0_8_ = (undefined8)resolver_1;
  }
  local_1b8._M_unused._M_object = (void *)0x0;
  if ((Data *)local_338._M_unused._0_8_ == (Data *)0x0) {
    local_338._8_8_ = (PromiseData<double> *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_338._8_8_ = local_338._M_unused._M_function_pointer;
  }
  _value = (Data *)0x0;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &(((PromiseData<double> *)local_338._8_8_)->
      super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
    super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QAtomicInt *)
            &(((PromiseData<double> *)local_338._8_8_)->
             super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
           super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver_5.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       local_338._M_unused._0_8_;
  lock.q_val = local_338._8_8_;
  std::function<(anonymous_namespace)::Enum1_(const_int_&)>::function
            ((function<(anonymous_namespace)::Enum1_(const_int_&)> *)local_328,
             (function<(anonymous_namespace)::Enum1_(const_int_&)> *)&p);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  puVar18 = (undefined8 *)operator_new(0x30);
  *puVar18 = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  puVar18[1] = local_338._8_8_;
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_338._8_8_ = *(int *)local_338._8_8_ + 1;
    UNLOCK();
  }
  std::function<(anonymous_namespace)::Enum1_(const_int_&)>::function
            ((function<(anonymous_namespace)::Enum1_(const_int_&)> *)(puVar18 + 2),
             (function<(anonymous_namespace)::Enum1_(const_int_&)> *)local_328);
  pcStack_80 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  local_98._M_unused._M_object = puVar18;
  QtPromisePrivate::
  PromiseHandler<int,std::function<(anonymous_namespace)::Enum1(int_const&)>,int_const&>::
  create<QtPromise::QPromiseResolve<(anonymous_namespace)::Enum1>,QtPromise::QPromiseReject<(anonymous_namespace)::Enum1>>(std::function<(anonymous_namespace)::Enum1(int_const&)>const&,QtPromise::QPromiseResolve<(anonymous_namespace)::Enum1>const&,QtPromise::QPromiseReject<(anonymous_namespace)::Enum1>const&)
  ::{lambda(int_const&)#1}::~create((_lambda_int_const___1_ *)&local_338);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            ((PromiseDataBase<int,_void_(const_int_&)> *)uStack_2c0,
             (function<void_(const_int_&)> *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  local_338._M_unused._M_object = (void *)lock.q_val;
  if (lock.q_val != 0) {
    LOCK();
    *(int *)lock.q_val = *(int *)lock.q_val + 1;
    UNLOCK();
  }
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(8);
  *(void **)local_b8._M_unused._0_8_ = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  pcStack_a0 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
             ::_M_manager;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
              *)&local_338);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            ((PromiseDataBase<int,_void_(const_int_&)> *)uStack_2c0,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
              *)&lock);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
              *)&value);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
              *)&resolver_5);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
              *)&local_1b8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
              *)&resolver_1);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_001475a0;
  bVar15 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     ((PromiseDataBase<int,_void_(const_int_&)> *)uStack_2c0);
  if (!bVar15) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              ((PromiseDataBase<int,_void_(const_int_&)> *)uStack_2c0);
  }
  std::_Function_base::~_Function_base((_Function_base *)&p);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver_3);
  _value = _value & 0xffffffff00000000;
  local_2f8._0_8_ = &PTR__QPromiseBase_001481a0;
  pPVar19 = (PromiseData<(anonymous_namespace)::Bar> *)operator_new(0x58);
  (((PromiseDataBase<void,_void_()> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<void,_void_()> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.size = 0;
  (((PromiseDataBase<void,_void_()> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.size = 0;
  (((PromiseDataBase<void,_void_()> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<void,_void_()> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<void,_void_()> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)
    &pPVar19->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)
    &pPVar19->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)
  &pPVar19->
   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)
    &pPVar19->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    super_QSharedData = 0;
  (((PromiseDataBase<void,_void_()> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)pPVar19);
  LOCK();
  pQVar1 = &((PromiseDataBase<void,_void_()> *)
            &pPVar19->
             super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
            )->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar19 != (PromiseData<(anonymous_namespace)::Bar> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<void,_void_()> *)
              &pPVar19->
               super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              )->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001484d8;
  local_2f8._8_8_ = pPVar19;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)pPVar19;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_3,(QPromise<void> *)&p);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&p);
  if (resolver_3.m_d.d == (Data *)0x0) {
    local_338._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    local_338._M_unused._0_8_ = (undefined8)resolver_3;
  }
  resolver_5.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if ((Data *)local_338._M_unused._0_8_ == (Data *)0x0) {
    local_338._8_8_ = (PromiseData<double> *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_338._8_8_ = local_338._M_unused._M_function_pointer;
  }
  lock.q_val = 0;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &(((PromiseData<double> *)local_338._8_8_)->
      super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
    super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QAtomicInt *)
            &(((PromiseData<double> *)local_338._8_8_)->
             super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
           super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_328._0_8_ = &value;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       local_338._M_unused._0_8_;
  local_1b8._M_unused._0_8_ = local_338._8_8_;
  local_58._M_unused._M_object = operator_new(0x18);
  *(void **)local_58._M_unused._0_8_ = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_338._8_8_;
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_338._8_8_ = *(int *)local_338._8_8_ + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = local_328._0_8_;
  pcStack_40 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<(anonymous_namespace)::Enum1,waitForValue<(anonymous_namespace)::Enum1>(QtPromise::QPromise<(anonymous_namespace)::Enum1>const&,(anonymous_namespace)::Enum1_const&)::{lambda((anonymous_namespace)::Enum1_const&)#1}((anonymous_namespace)::Enum1_const&)#1},(anonymous_namespace)::Enum1_const&>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForValue<(anonymous_namespace)::Enum1>(QtPromise::QPromise<(anonymous_namespace)::Enum1>const&,(anonymous_namespace)::Enum1_const&)::{lambda((anonymous_namespace)::Enum1_const&)#1}((anonymous_namespace)::Enum1_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda((anonymous_namespace)::Enum1_const&)#1}::~function
            ((_lambda__anonymous_namespace___Enum1_const___1_ *)&local_338);
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addHandler((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)pPVar17,(function<void_(const_(anonymous_namespace)::Enum1_&)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  local_338._M_unused._M_object = local_1b8._M_unused._M_object;
  if ((PromiseData<double> *)local_1b8._M_unused._0_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_1b8._M_unused._0_8_ = *local_1b8._M_unused._M_object + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(8);
  *(void **)local_78._M_unused._0_8_ = local_338._M_unused._M_object;
  if ((PromiseData<double> *)local_338._M_unused._0_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  pcStack_60 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
             ::_M_manager;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_338);
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addCatcher((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)pPVar17,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1b8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)&lock);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_5.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_3.m_d);
  local_2f8._0_8_ = &PTR__QPromiseBase_001484d8;
  bVar15 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                        *)pPVar17);
  if (!bVar15) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)pPVar17);
  }
  QtPromise::QPromiseBase<void>::wait((QPromiseBase<void> *)&local_338,local_2f8);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_338);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)local_2f8);
  EVar13 = value;
  local_128._0_4_ = value;
  local_338._0_4_ = 1;
  pcVar20 = QTest::toString<(anonymous_namespace)::Enum1>((Enum1 *)local_128._M_pod_data);
  pcVar21 = QTest::toString<(anonymous_namespace)::Enum1>((Enum1 *)local_338._M_pod_data);
  cVar14 = QTest::compare_helper
                     (EVar13 == Value1,"Compared values are not the same",pcVar20,pcVar21,
                      "waitForValue(p, Enum1::Value0)","Enum1::Value1",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                      ,99);
  if (cVar14 == '\0') {
    QtPromise::QPromiseBase<(anonymous_namespace)::Enum1>::~QPromiseBase
              ((QPromiseBase<(anonymous_namespace)::Enum1> *)&resolver);
    return;
  }
  bVar15 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                        *)pPVar17);
  if (bVar15) {
    bVar15 = false;
  }
  else {
    bVar15 = QtPromisePrivate::PromiseError::isNull
                       (&((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                           *)&pPVar17->
                              super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                         )->m_error);
  }
  cVar14 = QTest::qVerify(bVar15,"p.isFulfilled()","",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                          ,100);
  QtPromise::QPromiseBase<(anonymous_namespace)::Enum1>::~QPromiseBase
            ((QPromiseBase<(anonymous_namespace)::Enum1> *)&resolver);
  if (cVar14 == '\0') {
    return;
  }
  local_230.d = (Data *)CONCAT44(local_230.d._4_4_,1);
  QtPromise::resolve<(anonymous_namespace)::Enum1>((QtPromise *)&resolver,(Enum1 *)&local_230);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_00147340;
  pPVar19 = (PromiseData<(anonymous_namespace)::Bar> *)operator_new(0x68);
  ((PromiseDataBase<double,_void_(const_double_&)> *)
  &pPVar19->
   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<double,_void_(const_double_&)> *)
    &pPVar19->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    super_QSharedData = 0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_error).m_data._M_exception_object = (void *)0x0;
  (pPVar19->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.size = 0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.size = 0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<double,_void_(const_double_&)> *)
    &pPVar19->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<double,_void_(const_double_&)> *)
    &pPVar19->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_settled = 0;
  (pPVar19->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((PromiseDataBase<double,_void_(const_double_&)> *)
  &pPVar19->
   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00147868;
  QReadWriteLock::QReadWriteLock
            (&((PromiseDataBase<double,_void_(const_double_&)> *)
              &pPVar19->
               super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              )->m_lock,0);
  ((PromiseDataBase<double,_void_(const_double_&)> *)
  &pPVar19->
   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_settled = false;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.size = 0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_error).m_data._M_exception_object = (void *)0x0;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<double,_void_(const_double_&)> *)
   &pPVar19->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.size = 0;
  ((PromiseDataBase<double,_void_(const_double_&)> *)
  &pPVar19->
   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_00147800;
  (pPVar19->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar19->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &((PromiseDataBase<double,_void_(const_double_&)> *)
            &pPVar19->
             super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
            )->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar19 != (PromiseData<(anonymous_namespace)::Bar> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<double,_void_(const_double_&)> *)
              &pPVar19->
               super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              )->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2f8._0_8_ = &PTR__QPromiseBase_001477c8;
  local_2f8._8_8_ = pPVar19;
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x10);
  (((Data *)resolver_3.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  ((Data *)resolver_3.m_d.d)->promise = (QPromise<void> *)0x0;
  LOCK();
  (((Data *)resolver_3.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
       (((Data *)resolver_3.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  puVar18 = (undefined8 *)operator_new(0x10);
  PVar10.m_d.d = resolver_3.m_d.d;
  uVar8 = local_2f8._8_8_;
  local_2f8._8_8_ = (PromiseData<(anonymous_namespace)::Bar> *)0x0;
  puVar18[1] = uVar8;
  *puVar18 = &PTR__QPromiseBase_001477c8;
  *(undefined8 **)((long)resolver_3.m_d.d + 8) = puVar18;
  QtPromise::QPromiseBase<(anonymous_namespace)::Enum2>::~QPromiseBase
            ((QPromiseBase<(anonymous_namespace)::Enum2> *)local_2f8);
  LOCK();
  *(int *)PVar10.m_d.d = *(int *)PVar10.m_d.d + 1;
  UNLOCK();
  local_1b8._M_unused._M_object = (void *)0x0;
  resolver_5 = PVar10;
  if (resolver_3.m_d.d == (Data *)0x0) {
    local_338._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    local_338._8_8_ = resolver_3;
  }
  p_6.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)0x0;
  local_338._M_unused._M_object = (void *)PVar10.m_d.d;
  if (PVar10.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar10.m_d.d = *(int *)PVar10.m_d.d + 1;
    UNLOCK();
  }
  local_1f8 = &PTR__QPromiseBase_001484d8;
  if ((Data *)local_338._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_338._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_338._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lock.q_val = local_338._8_8_;
  std::function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)
             local_328,
             (function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)&p);
  local_148 = (_Manager_type)0x0;
  p_Stack_140 = (_Invoker_type)0x0;
  _value = (Data *)0x0;
  uStack_150 = 0;
  pDVar22 = (Data *)operator_new(0x30);
  *(void **)pDVar22 = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  pDVar22->promise = (QPromise<(anonymous_namespace)::Enum1> *)local_338._8_8_;
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_338._8_8_ = *(int *)local_338._8_8_ + 1;
    UNLOCK();
  }
  std::function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)
             (pDVar22 + 1),
             (function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)
             local_328);
  p_Stack_140 = std::
                _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
              ::_M_manager;
  _value = pDVar22;
  QtPromisePrivate::
  PromiseHandler<(anonymous_namespace)::Enum1,std::function<(anonymous_namespace)::Enum2((anonymous_namespace)::Enum1_const&)>,(anonymous_namespace)::Enum1_const&>
  ::
  create<QtPromise::QPromiseResolve<(anonymous_namespace)::Enum2>,QtPromise::QPromiseReject<(anonymous_namespace)::Enum2>>(std::function<(anonymous_namespace)::Enum2((anonymous_namespace)::Enum1_const&)>const&,QtPromise::QPromiseResolve<(anonymous_namespace)::Enum2>const&,QtPromise::QPromiseReject<(anonymous_namespace)::Enum2>const&)
  ::{lambda((anonymous_namespace)::Enum1_const&)#1}::~create
            ((_lambda__anonymous_namespace___Enum1_const___1_ *)&local_338);
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addHandler((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)pPVar17,(function<void_(const_(anonymous_namespace)::Enum1_&)> *)&value);
  std::_Function_base::~_Function_base((_Function_base *)&value);
  local_338._M_unused._M_object = (void *)lock.q_val;
  if (lock.q_val != 0) {
    LOCK();
    *(int *)lock.q_val = *(int *)lock.q_val + 1;
    UNLOCK();
  }
  local_118 = (code *)0x0;
  pcStack_110 = (code *)0x0;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_128._M_unused._M_object = operator_new(8);
  *(void **)local_128._M_unused._0_8_ = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  pcStack_110 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
              ::_M_manager;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
              *)&local_338);
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addCatcher((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)pPVar17,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
              *)&lock);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
              *)&p_6);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
              *)&resolver_5);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
              *)&local_1b8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::Data>
              *)&resolver_3);
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_001477c8;
  bVar15 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                        *)pPVar17);
  if (!bVar15) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)pPVar17);
  }
  std::_Function_base::~_Function_base((_Function_base *)&p);
  QtPromise::QPromiseBase<(anonymous_namespace)::Enum1>::~QPromiseBase
            ((QPromiseBase<(anonymous_namespace)::Enum1> *)&resolver);
  _value_1 = (Data *)((ulong)uStack_2cc << 0x20);
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_001481a0;
  this_00 = (PromiseDataBase<QString,_void_(const_QString_&)> *)operator_new(0x58);
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_00);
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseDataBase<QString,_void_(const_QString_&)> *)0x0) {
    LOCK();
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_001484d8;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_5,(QPromise<void> *)&resolver);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver);
  if (resolver_5.m_d.d == (Data *)0x0) {
    local_338._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + 1;
    UNLOCK();
    local_338._M_unused._0_8_ = (undefined8)resolver_5;
  }
  local_230.d = (Data *)0x0;
  if ((Data *)local_338._M_unused._0_8_ == (Data *)0x0) {
    local_338._8_8_ = (PromiseData<double> *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_338._8_8_ = local_338._M_unused._M_function_pointer;
  }
  resolver_8.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &(((PromiseData<double> *)local_338._8_8_)->
      super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
    super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QAtomicInt *)
            &(((PromiseData<double> *)local_338._8_8_)->
             super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
           super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_328._0_8_ = &value_1;
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  local_1a8._0_8_ = (Data *)0x0;
  local_1a8._8_8_ =
       (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *)0x0;
  p_5.super_QPromiseBase<(anonymous_namespace)::Bar>._vptr_QPromiseBase =
       (_func_int **)local_338._8_8_;
  p_6.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)local_338._M_unused._0_8_;
  local_1b8._M_unused._M_object = operator_new(0x18);
  *(void **)local_1b8._M_unused._0_8_ = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 8) = local_338._8_8_;
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_338._8_8_ = *(int *)local_338._8_8_ + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_1b8._M_unused._0_8_ + 0x10) = local_328._0_8_;
  local_1a8._8_8_ =
       std::
       _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_invoke;
  local_1a8._0_8_ =
       std::
       _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<(anonymous_namespace)::Enum2,waitForValue<(anonymous_namespace)::Enum2>(QtPromise::QPromise<(anonymous_namespace)::Enum2>const&,(anonymous_namespace)::Enum2_const&)::{lambda((anonymous_namespace)::Enum2_const&)#1}((anonymous_namespace)::Enum2_const&)#1},(anonymous_namespace)::Enum2_const&>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForValue<(anonymous_namespace)::Enum2>(QtPromise::QPromise<(anonymous_namespace)::Enum2>const&,(anonymous_namespace)::Enum2_const&)::{lambda((anonymous_namespace)::Enum2_const&)#1}((anonymous_namespace)::Enum2_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda((anonymous_namespace)::Enum2_const&)#1}::~function
            ((_lambda__anonymous_namespace___Enum2_const___1_ *)&local_338);
  lock.q_val = (quintptr)
               &((PromiseDataBase<double,_void_(const_double_&)> *)
                &pPVar19->
                 super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                )->m_lock;
  QWriteLocker::relock(&lock);
  pQVar23 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&p,pQVar23);
  old = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *)
        local_1a8._8_8_;
  if ((Data *)local_1a8._0_8_ != (Data *)0x0) {
    old = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *)
          local_1a8;
    local_1a8._0_8_ = (Data *)0x0;
    local_1a8._8_8_ =
         (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *)0x0
    ;
  }
  pQVar2 = &((PromiseDataBase<double,_void_(const_double_&)> *)
            &pPVar19->
             super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
            )->m_handlers;
  pDVar5 = (((PromiseDataBase<double,_void_(const_double_&)> *)
            &pPVar19->
             super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
            )->m_handlers).d.d;
  lVar6 = (((PromiseDataBase<double,_void_(const_double_&)> *)
           &pPVar19->
            super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
           )->m_handlers).d.size;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00109bc8:
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::pair
              ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                *)&local_338,
               (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                *)&p);
    lVar32 = extraout_RDX;
    if ((pDVar5 == (Data *)0x0) ||
       (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
    goto LAB_00109bf2;
    qVar24 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
             ::freeSpaceAtEnd((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                               *)pQVar2);
    qVar26 = lVar6;
    if (qVar24 < 1) {
      qVar26 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
               ::freeSpaceAtBegin((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                                   *)pQVar2);
      lVar32 = extraout_RDX_00;
      if (qVar26 < 1) {
LAB_00109bf2:
        QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
        ::reallocateAndGrow((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                             *)pQVar2,GrowsAtEnd,lVar32,
                            (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                             *)old);
      }
      else {
        lVar33 = (pDVar5->super_QArrayData).alloc;
        lVar32 = lVar6 * 3;
        old = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
               *)(lVar33 * 2);
        if (SBORROW8(lVar32,(long)old) == lVar32 + lVar33 * -2 < 0) goto LAB_00109bf2;
        ppVar28 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                   *)(((PromiseDataBase<double,_void_(const_double_&)> *)
                      &pPVar19->
                       super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                      )->m_handlers).d.ptr;
        pPVar17 = (PromiseData<(anonymous_namespace)::Bar> *)(ppVar28 + -qVar26);
        if (ppVar28 !=
            (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
            0x0 && lVar6 != 0) {
          ppVar30 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                     *)((QWeakPointer<QObject> *)
                        &((PromiseDataBase<double,_void_(const_double_&)> *)
                         &pPVar17->
                          super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                         )->_vptr_PromiseDataBase + lVar6 * 3);
          ppVar34 = ppVar28;
          local_2f8._8_8_ = pPVar17;
          local_108 = pPVar17;
          ppVar31 = ppVar30;
          if (ppVar28 < ppVar30) {
            ppVar31 = ppVar28;
          }
          for (; ppVar34 + -qVar26 != ppVar31; ppVar34 = ppVar34 + 1) {
            std::
            pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
            pair((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                  *)(ppVar34 + -qVar26),
                 (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                  *)ppVar34);
          }
          local_2f8._0_8_ = &local_2e8;
          local_2e8 = ppVar31;
          for (; ppVar31 != ppVar30; ppVar31 = ppVar31 + 1) {
            std::
            pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
            operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                       *)ppVar31,(type)ppVar34);
            ppVar34 = ppVar34 + 1;
          }
          if (ppVar28 < ppVar30) {
            ppVar28 = ppVar30;
          }
          local_2f8._0_8_ = local_2f8 + 8;
          while (ppVar34 != ppVar28) {
            ppVar34 = ppVar34 + -1;
            std::
            pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
            ~pair((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                   *)ppVar34);
          }
          pPVar29 = *(PromiseData<(anonymous_namespace)::Bar> **)local_2f8._0_8_;
          bVar15 = pPVar29 < (ulong)local_2f8._8_8_;
          while (pPVar17 = local_108,
                pPVar29 != (PromiseData<(anonymous_namespace)::Bar> *)local_2f8._8_8_) {
            *(QWeakPointer<QObject> **)local_2f8._0_8_ =
                 (QWeakPointer<QObject> *)
                 &((PromiseDataBase<double,_void_(const_double_&)> *)
                  &pPVar29->
                   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                  )->_vptr_PromiseDataBase + ((ulong)bVar15 - 1 | 1) * 3;
            std::
            pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
            ~pair(*(pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                    **)local_2f8._0_8_);
            pPVar29 = *(PromiseData<(anonymous_namespace)::Bar> **)local_2f8._0_8_;
          }
        }
        (((PromiseDataBase<double,_void_(const_double_&)> *)
         &pPVar19->
          super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
         )->m_handlers).d.ptr =
             (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)pPVar17;
      }
      qVar26 = (((PromiseDataBase<double,_void_(const_double_&)> *)
                &pPVar19->
                 super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                )->m_handlers).d.size;
    }
    ppVar7 = (((PromiseDataBase<double,_void_(const_double_&)> *)
              &pPVar19->
               super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              )->m_handlers).d.ptr;
    if (qVar26 - lVar6 < 1) {
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
      pair((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *)
           (ppVar7 + qVar26),
           (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *)
           &local_338);
    }
    else {
      lVar32 = -(qVar26 - lVar6);
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
      pair((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *)
           (ppVar7 + qVar26),
           (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *)
           (ppVar7 + qVar26 + -1));
      this_04 = ppVar7 + qVar26 + -1;
      while( true ) {
        lVar32 = lVar32 + 1;
        if (lVar32 == 0) break;
        std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
        operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                   *)this_04,(type)(this_04 + -1));
        this_04 = this_04 + -1;
      }
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
      operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                 *)(ppVar7 + lVar6),(type)&local_338);
    }
    (((PromiseDataBase<double,_void_(const_double_&)> *)
     &pPVar19->
      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
    ->m_handlers).d.ptr = ppVar7;
    (((PromiseDataBase<double,_void_(const_double_&)> *)
     &pPVar19->
      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
    ->m_handlers).d.size = qVar26 + 1;
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::~pair
              ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                *)&local_338);
  }
  else {
    qVar26 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
             ::freeSpaceAtEnd((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                               *)pQVar2);
    if (qVar26 == 0) {
      if (lVar6 == 0) {
        qVar26 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                 ::freeSpaceAtBegin((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                                     *)pQVar2);
        if (qVar26 != 0) {
          std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
          ::pair((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                  *)((((PromiseDataBase<double,_void_(const_double_&)> *)
                      &pPVar19->
                       super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                      )->m_handlers).d.ptr + -1),
                 (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                  *)&p);
          pppVar4 = &(((PromiseDataBase<double,_void_(const_double_&)> *)
                      &pPVar19->
                       super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                      )->m_handlers).d.ptr;
          *pppVar4 = *pppVar4 + -1;
          goto LAB_00109c8c;
        }
      }
      goto LAB_00109bc8;
    }
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::pair
              ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                *)((((PromiseDataBase<double,_void_(const_double_&)> *)
                    &pPVar19->
                     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                    )->m_handlers).d.ptr + lVar6),
               (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                *)&p);
LAB_00109c8c:
    pqVar3 = &(((PromiseDataBase<double,_void_(const_double_&)> *)
               &pPVar19->
                super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
               )->m_handlers).d.size;
    *pqVar3 = *pqVar3 + 1;
  }
  std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::~pair
            ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *
             )&p);
  QWriteLocker::~QWriteLocker(&lock);
  std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
  local_338._M_unused._M_object =
       p_5.super_QPromiseBase<(anonymous_namespace)::Bar>._vptr_QPromiseBase;
  if (p_5.super_QPromiseBase<(anonymous_namespace)::Bar>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p_5.super_QPromiseBase<(anonymous_namespace)::Bar>._vptr_QPromiseBase =
         *(int *)p_5.super_QPromiseBase<(anonymous_namespace)::Bar>._vptr_QPromiseBase + 1;
    UNLOCK();
  }
  lock.q_val = 0;
  lock.q_val = (quintptr)operator_new(8);
  *(void **)lock.q_val = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_338);
  lock_1.q_val = (quintptr)
                 &((PromiseDataBase<double,_void_(const_double_&)> *)
                  &pPVar19->
                   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                  )->m_lock;
  QWriteLocker::relock(&lock_1);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)QThread::currentThread();
  std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>::
  pair<QThread_*,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>,_true>
            ((pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
              *)&local_338,(QThread **)&p,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&lock);
  QList<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>::
  emplaceBack<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
            ((QList<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
              *)&((PromiseDataBase<double,_void_(const_double_&)> *)
                 &pPVar19->
                  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                 )->m_catchers,
             (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
              *)&local_338);
  std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>::~pair
            ((pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
              *)&local_338);
  QWriteLocker::~QWriteLocker(&lock_1);
  std::_Function_base::~_Function_base((_Function_base *)&lock);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)&p_5);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_8.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)&p_6);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_230);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_5.m_d);
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_001484d8;
  bVar15 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
                        *)pPVar19);
  if (!bVar15) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>::
    dispatch((PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
              *)pPVar19);
  }
  QtPromise::QPromiseBase<void>::wait((QPromiseBase<void> *)&local_338,&resolver_3);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_338);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver_3);
  EVar9 = value_1;
  local_1f0.d._0_4_ = value_1;
  local_338._0_4_ = 1;
  pcVar20 = QTest::toString<(anonymous_namespace)::Enum2>((Enum2 *)&local_1f0);
  pcVar21 = QTest::toString<(anonymous_namespace)::Enum2>((Enum2 *)local_338._M_pod_data);
  cVar14 = QTest::compare_helper
                     (EVar9 == Value1,"Compared values are not the same",pcVar20,pcVar21,
                      "waitForValue(p, Enum2::Value0)","Enum2::Value1",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                      ,0x6d);
  if (cVar14 == '\0') {
    QtPromise::QPromiseBase<(anonymous_namespace)::Enum2>::~QPromiseBase
              ((QPromiseBase<(anonymous_namespace)::Enum2> *)&resolver_1);
    return;
  }
  bVar15 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
                        *)pPVar19);
  if (bVar15) {
    bVar15 = false;
  }
  else {
    bVar15 = QtPromisePrivate::PromiseError::isNull
                       (&((PromiseDataBase<double,_void_(const_double_&)> *)
                         &pPVar19->
                          super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                         )->m_error);
  }
  cVar14 = QTest::qVerify(bVar15,"p.isFulfilled()","",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                          ,0x6e);
  QtPromise::QPromiseBase<(anonymous_namespace)::Enum2>::~QPromiseBase
            ((QPromiseBase<(anonymous_namespace)::Enum2> *)&resolver_1);
  if (cVar14 == '\0') {
    return;
  }
  QByteArray::QByteArray((QByteArray *)&local_338,"foo",-1);
  local_2f8._0_8_ = &PTR__QPromiseBase_00148140;
  pPVar17 = (PromiseData<(anonymous_namespace)::Bar> *)operator_new(0x68);
  (((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_error).m_data._M_exception_object = (void *)0x0;
  ((__shared_ptr<QByteArray,_(__gnu_cxx::_Lock_policy)2> *)
  &(pPVar17->m_value).m_data.
   super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>)->_M_ptr =
       (element_type *)0x0;
  (((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.size = 0;
  (((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.size = 0;
  (((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
   &pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    m_settled = 0;
  ((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
  &pPVar17->
   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    super_QSharedData = 0;
  (((__shared_ptr<QByteArray,_(__gnu_cxx::_Lock_policy)2> *)
   &(pPVar17->m_value).m_data.
    super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>)->_M_refcount)._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QByteArray>::PromiseData((PromiseData<QByteArray> *)pPVar17);
  LOCK();
  pQVar1 = &((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
            &pPVar17->
             super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
            )->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar17 != (PromiseData<(anonymous_namespace)::Bar> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
              &pPVar17->
               super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              )->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001485b0;
  local_2f8._8_8_ = pPVar17;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)pPVar17;
  QtPromisePrivate::PromiseResolver<QByteArray>::PromiseResolver
            ((PromiseResolver<QByteArray> *)&resolver_3,(QPromise<QByteArray> *)&p);
  QtPromise::QPromiseBase<QByteArray>::~QPromiseBase((QPromiseBase<QByteArray> *)&p);
  if (resolver_3.m_d.d == (Data *)0x0) {
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)resolver_3;
  }
  resolver_5.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if (resolver_1.m_d.d == (Data *)0x0) {
    p_6.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    p_6.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)resolver_1.m_d.d;
  }
  local_230.d = (Data *)0x0;
  QtPromisePrivate::PromiseResolver<QByteArray>::resolve<QByteArray>
            ((PromiseResolver<QByteArray> *)&resolver_1,(QByteArray *)&local_338);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> *)
             &p_6);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> *)
             &local_230);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> *)
             &resolver_5);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> *)
             &resolver_3);
  local_2f8._0_8_ = &PTR__QPromiseBase_001485b0;
  QtPromise::QPromise<QByteArray>::convert<QString>((QPromise<QByteArray> *)&resolver);
  QtPromise::QPromiseBase<QByteArray>::~QPromiseBase((QPromiseBase<QByteArray> *)local_2f8);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_338);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  waitForValue<QString>((QString *)&local_338,(QPromise<QString> *)&resolver,(QString *)&p);
  QString::QString((QString *)local_2f8,"foo");
  bVar15 = QTest::qCompare((QString *)&local_338,(QString *)local_2f8,"waitForValue(p, QString{})",
                           "QString{\"foo\"}",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_2f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_338);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
  if (!bVar15) {
    this_03 = (QPromiseBase<QString> *)&resolver;
    goto LAB_0010a3af;
  }
  bVar15 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isFulfilled(this_00);
  cVar14 = QTest::qVerify(bVar15,"p.isFulfilled()","",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                          ,0x79);
  QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&resolver);
  if (cVar14 == '\0') {
    return;
  }
  local_1f0.d._0_4_ = 0x2a;
  QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&resolver,(Foo *)&local_1f0);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  p_5.super_QPromiseBase<(anonymous_namespace)::Bar>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_001473a0;
  pPVar17 = (PromiseData<(anonymous_namespace)::Bar> *)operator_new(0x68);
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
    super_QSharedData = 0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar17->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_catchers.d.size = 0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_handlers.d.size = 0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_catchers.d.d = (Data *)0x0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_handlers.d.d = (Data *)0x0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_handlers.d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &(pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
    m_lock = 0;
  *(undefined8 *)
   &(pPVar17->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
    m_settled = 0;
  (pPVar17->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00147d38;
  QReadWriteLock::QReadWriteLock
            (&(pPVar17->
              super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              ).m_lock,0);
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_settled = false;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_handlers.d.d = (Data *)0x0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_handlers.d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_handlers.d.size = 0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_catchers.d.d = (Data *)0x0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  m_catchers.d.size = 0;
  (pPVar17->
  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
  _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_00147cd0;
  (pPVar17->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar17->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(pPVar17->
            super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
            ).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar17 != (PromiseData<(anonymous_namespace)::Bar> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar17->
              super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              ).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2f8._0_8_ = &PTR__QPromiseBase_00147c98;
  local_2f8._8_8_ = pPVar17;
  p_5.super_QPromiseBase<(anonymous_namespace)::Bar>.m_d.d = pPVar17;
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x10);
  (((Data *)resolver_3.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  ((Data *)resolver_3.m_d.d)->promise = (QPromise<void> *)0x0;
  LOCK();
  (((Data *)resolver_3.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
       (((Data *)resolver_3.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  puVar18 = (undefined8 *)operator_new(0x10);
  PVar10.m_d.d = resolver_3.m_d.d;
  uVar8 = local_2f8._8_8_;
  local_2f8._8_8_ = (PromiseData<(anonymous_namespace)::Bar> *)0x0;
  puVar18[1] = uVar8;
  *puVar18 = &PTR__QPromiseBase_00147c98;
  *(undefined8 **)((long)resolver_3.m_d.d + 8) = puVar18;
  QtPromise::QPromiseBase<(anonymous_namespace)::Bar>::~QPromiseBase
            ((QPromiseBase<(anonymous_namespace)::Bar> *)local_2f8);
  LOCK();
  *(int *)PVar10.m_d.d = *(int *)PVar10.m_d.d + 1;
  UNLOCK();
  local_230.d = (Data *)0x0;
  p_6.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)PVar10.m_d.d;
  if (resolver_3.m_d.d == (Data *)0x0) {
    local_338._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    local_338._8_8_ = resolver_3;
  }
  _value_1 = (Data *)0x0;
  local_338._M_unused._M_object = (void *)PVar10.m_d.d;
  if (PVar10.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar10.m_d.d = *(int *)PVar10.m_d.d + 1;
    UNLOCK();
  }
  if ((Data *)local_338._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_338._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_338._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver_8.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)local_338._8_8_;
  std::function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)>::function
            ((function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)local_328,
             (function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)&p);
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  QVar25.d = (Data *)operator_new(0x30);
  *(void **)QVar25.d = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  (QVar25.d)->promise = (QPromise<int> *)local_338._8_8_;
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_338._8_8_ = *(int *)local_338._8_8_ + 1;
    UNLOCK();
  }
  std::function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)>::function
            ((function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)
             (QVar25.d + 1),
             (function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)local_328)
  ;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)QVar25.d;
  QtPromisePrivate::
  PromiseHandler<(anonymous_namespace)::Foo,std::function<(anonymous_namespace)::Bar((anonymous_namespace)::Foo_const&)>,(anonymous_namespace)::Foo_const&>
  ::
  create<QtPromise::QPromiseResolve<(anonymous_namespace)::Bar>,QtPromise::QPromiseReject<(anonymous_namespace)::Bar>>(std::function<(anonymous_namespace)::Bar((anonymous_namespace)::Foo_const&)>const&,QtPromise::QPromiseResolve<(anonymous_namespace)::Bar>const&,QtPromise::QPromiseReject<(anonymous_namespace)::Bar>const&)
  ::{lambda((anonymous_namespace)::Foo_const&)#1}::~create
            ((_lambda__anonymous_namespace___Foo_const___1_ *)&local_338);
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addHandler
            ((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
              *)this_00,(function<void_(const_(anonymous_namespace)::Foo_&)> *)&resolver_1);
  std::_Function_base::~_Function_base((_Function_base *)&resolver_1);
  local_338._M_unused._M_object = (void *)resolver_8.m_d.d;
  if (resolver_8.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
    UNLOCK();
  }
  resolver_5.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  resolver_5.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)operator_new(8);
  *(void **)resolver_5.m_d.d = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
              *)&local_338);
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addCatcher
            ((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
              *)this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver_5);
  std::_Function_base::~_Function_base((_Function_base *)&resolver_5);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
              *)&resolver_8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
              *)&value_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
              *)&p_6);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
              *)&local_230);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
  ::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Bar>::Data>
              *)&resolver_3);
  p_5.super_QPromiseBase<(anonymous_namespace)::Bar>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00147c98;
  bVar15 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
           isPending((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                      *)this_00);
  if (!bVar15) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::dispatch
              ((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                *)this_00);
  }
  std::_Function_base::~_Function_base((_Function_base *)&p);
  QtPromise::QPromiseBase<(anonymous_namespace)::Foo>::~QPromiseBase
            ((QPromiseBase<(anonymous_namespace)::Foo> *)&resolver);
  value_2.m_bar = 0xffffffff;
  local_230.d = (Data *)&PTR__QPromiseBase_001481a0;
  this_01 = (PromiseData<QString> *)operator_new(0x58);
  (((PromiseDataBase<void,_void_()> *)
   &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<void,_void_()> *)
   &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.size = 0;
  (((PromiseDataBase<void,_void_()> *)
   &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.size = 0;
  (((PromiseDataBase<void,_void_()> *)
   &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<void,_void_()> *)
   &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<void,_void_()> *)
   &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)
    &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)
    &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)
  &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<void,_void_()> *)
    &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->super_QSharedData = 0;
  (((PromiseDataBase<void,_void_()> *)
   &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_error).m_data.
  _M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_01);
  LOCK();
  pQVar1 = &((PromiseDataBase<void,_void_()> *)
            &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseData<QString> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<void,_void_()> *)
              &this_01->super_PromiseDataBase<QString,_void_(const_QString_&)>)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_6.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001484d8;
  p_6.super_QPromiseBase<QString>.m_d.d = this_01;
  local_230.ptr = (char16_t *)this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_8,(QPromise<void> *)&p_6);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&p_6);
  QVar11 = p_5.super_QPromiseBase<(anonymous_namespace)::Bar>.m_d;
  if (resolver_8.m_d.d == (Data *)0x0) {
    local_338._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
    UNLOCK();
    local_338._M_unused._0_8_ = (undefined8)resolver_8;
  }
  local_1f0.d = (Data *)0x0;
  if ((Data *)local_338._M_unused._0_8_ == (Data *)0x0) {
    local_338._8_8_ = (PromiseData<double> *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_338._8_8_ = local_338._M_unused._M_function_pointer;
  }
  local_1e8.d = (Data *)0x0;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_338._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &(((PromiseData<double> *)local_338._8_8_)->
      super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
    super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QAtomicInt *)
            &(((PromiseData<double> *)local_338._8_8_)->
             super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
           super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_328._0_8_ = &value_2;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)(Data *)0x0;
  local_298._0_8_ = (Data *)0x0;
  local_298._8_8_ =
       (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)0x0;
  _value_1 = (Data *)local_338._M_unused._0_8_;
  local_1e0.d = (Data *)local_338._8_8_;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       operator_new(0x18);
  *(void **)resolver.m_d.d = local_338._M_unused._M_object;
  if ((Data *)local_338._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<double> *)local_338._8_8_;
  if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_338._8_8_ = *(int *)local_338._8_8_ + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)resolver.m_d.d + 0x10) = local_328._0_8_;
  local_298._8_8_ =
       std::
       _Function_handler<void_(const_(anonymous_namespace)::Bar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_invoke;
  local_298._0_8_ =
       std::
       _Function_handler<void_(const_(anonymous_namespace)::Bar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<(anonymous_namespace)::Bar,waitForValue<(anonymous_namespace)::Bar>(QtPromise::QPromise<(anonymous_namespace)::Bar>const&,(anonymous_namespace)::Bar_const&)::{lambda((anonymous_namespace)::Bar_const&)#1}((anonymous_namespace)::Bar_const&)#1},(anonymous_namespace)::Bar_const&>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForValue<(anonymous_namespace)::Bar>(QtPromise::QPromise<(anonymous_namespace)::Bar>const&,(anonymous_namespace)::Bar_const&)::{lambda((anonymous_namespace)::Bar_const&)#1}((anonymous_namespace)::Bar_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda((anonymous_namespace)::Bar_const&)#1}::~function
            ((_lambda__anonymous_namespace___Bar_const___1_ *)&local_338);
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &((QVar11.d)->
        super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
        ).m_lock;
  QWriteLocker::relock((QWriteLocker *)&resolver_3);
  pQVar23 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&p,pQVar23);
  ppVar28 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
            local_298._8_8_;
  if ((Data *)local_298._0_8_ != (Data *)0x0) {
    ppVar28 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
              local_298;
    local_298._0_8_ = (Data *)0x0;
    local_298._8_8_ =
         (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)0x0;
  }
  pQVar2 = &((QVar11.d)->
            super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
            ).m_handlers;
  pDVar5 = ((QVar11.d)->
           super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
           ).m_handlers.d.d;
  lVar6 = ((QVar11.d)->
          super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
          ).m_handlers.d.size;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0010a7d9:
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::pair
              ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *
               )&local_338,
               (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *
               )&p);
    lVar32 = extraout_RDX_01;
    if ((pDVar5 == (Data *)0x0) ||
       (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
    goto LAB_0010a803;
    qVar26 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
             ::freeSpaceAtEnd((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                               *)pQVar2);
    lVar32 = lVar6;
    if (qVar26 < 1) {
      qVar26 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
               ::freeSpaceAtBegin((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                                   *)pQVar2);
      lVar32 = extraout_RDX_02;
      if (qVar26 < 1) {
LAB_0010a803:
        QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
        ::reallocateAndGrow((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                             *)pQVar2,GrowsAtEnd,lVar32,
                            (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                             *)ppVar28);
      }
      else {
        lVar33 = (pDVar5->super_QArrayData).alloc;
        lVar32 = lVar6 * 3;
        ppVar28 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                   *)(lVar33 * 2);
        if (SBORROW8(lVar32,(long)ppVar28) == lVar32 + lVar33 * -2 < 0) goto LAB_0010a803;
        ppVar28 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                   *)((QVar11.d)->
                     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                     ).m_handlers.d.ptr;
        pPVar17 = (PromiseData<(anonymous_namespace)::Bar> *)(ppVar28 + -qVar26);
        if (ppVar28 !=
            (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
            0x0 && lVar6 != 0) {
          ppVar30 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                     *)((QWeakPointer<QObject> *)
                        &((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
                         &pPVar17->
                          super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                         )->_vptr_PromiseDataBase + lVar6 * 3);
          ppVar34 = ppVar28;
          local_2f8._8_8_ = pPVar17;
          ppVar31 = ppVar30;
          if (ppVar28 < ppVar30) {
            ppVar31 = ppVar28;
          }
          for (; ppVar34 + -qVar26 != ppVar31; ppVar34 = ppVar34 + 1) {
            std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
            ::pair(ppVar34 + -qVar26,ppVar34);
          }
          local_2f8._0_8_ = &local_2e8;
          local_2e8 = ppVar31;
          for (; ppVar31 != ppVar30; ppVar31 = ppVar31 + 1) {
            std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
            ::operator=(ppVar31,ppVar34);
            ppVar34 = ppVar34 + 1;
          }
          if (ppVar28 < ppVar30) {
            ppVar28 = ppVar30;
          }
          local_2f8._0_8_ = local_2f8 + 8;
          while (ppVar34 != ppVar28) {
            ppVar34 = ppVar34 + -1;
            std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
            ::~pair(ppVar34);
          }
          pPVar19 = *(PromiseData<(anonymous_namespace)::Bar> **)local_2f8._0_8_;
          bVar15 = pPVar19 < (ulong)local_2f8._8_8_;
          while (pPVar19 != (PromiseData<(anonymous_namespace)::Bar> *)local_2f8._8_8_) {
            *(QWeakPointer<QObject> **)local_2f8._0_8_ =
                 (QWeakPointer<QObject> *)
                 &((PromiseDataBase<QByteArray,_void_(const_QByteArray_&)> *)
                  &pPVar19->
                   super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                  )->_vptr_PromiseDataBase + ((ulong)bVar15 - 1 | 1) * 3;
            std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
            ::~pair(*(pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                      **)local_2f8._0_8_);
            pPVar19 = *(PromiseData<(anonymous_namespace)::Bar> **)local_2f8._0_8_;
          }
        }
        ((QVar11.d)->
        super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
        ).m_handlers.d.ptr =
             (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)pPVar17;
      }
      lVar32 = ((QVar11.d)->
               super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
               ).m_handlers.d.size;
    }
    ppVar7 = ((QVar11.d)->
             super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
             ).m_handlers.d.ptr;
    if (lVar32 - lVar6 < 1) {
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::pair
                ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                  *)(ppVar7 + lVar32),
                 (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                  *)&local_338);
    }
    else {
      lVar33 = -(lVar32 - lVar6);
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::pair
                ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                  *)(ppVar7 + lVar32),
                 (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                  *)(ppVar7 + lVar32 + -1));
      ppVar28 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                 *)(ppVar7 + lVar32 + -1);
      while (lVar33 = lVar33 + 1, lVar33 != 0) {
        std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::
        operator=(ppVar28,ppVar28 + -1);
        ppVar28 = ppVar28 + -1;
      }
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::
      operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                 *)(ppVar7 + lVar6),(type)&local_338);
    }
    ((QVar11.d)->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
    m_handlers.d.ptr = ppVar7;
    ((QVar11.d)->
    super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>).
    m_handlers.d.size = lVar32 + 1;
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::~pair
              ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *
               )&local_338);
  }
  else {
    qVar26 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
             ::freeSpaceAtEnd((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                               *)pQVar2);
    if (qVar26 == 0) {
      if ((lVar6 != 0) ||
         (qVar26 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                   ::freeSpaceAtBegin((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                                       *)pQVar2), qVar26 == 0)) goto LAB_0010a7d9;
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::pair
                ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                  *)(((QVar11.d)->
                     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                     ).m_handlers.d.ptr + -1),
                 (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                  *)&p);
      pppVar4 = &((QVar11.d)->
                 super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                 ).m_handlers.d.ptr;
      *pppVar4 = *pppVar4 + -1;
    }
    else {
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::pair
                ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                  *)(((QVar11.d)->
                     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                     ).m_handlers.d.ptr + lVar6),
                 (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                  *)&p);
    }
    pqVar3 = &((QVar11.d)->
              super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              ).m_handlers.d.size;
    *pqVar3 = *pqVar3 + 1;
  }
  std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::~pair
            ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
             &p);
  QWriteLocker::~QWriteLocker((QWriteLocker *)&resolver_3);
  std::_Function_base::~_Function_base((_Function_base *)&resolver);
  QVar11 = p_5.super_QPromiseBase<(anonymous_namespace)::Bar>.m_d;
  local_338._M_unused._M_object = local_1e0.d;
  if ((PromiseData<double> *)local_1e0.d != (PromiseData<double> *)0x0) {
    LOCK();
    (((QAtomicInt *)
     &((PromiseDataBase<double,_void_(const_double_&)> *)&(local_1e0.d)->super_QSharedData)->
      _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (((QAtomicInt *)
          &((PromiseDataBase<double,_void_(const_double_&)> *)&(local_1e0.d)->super_QSharedData)->
           _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)operator_new(8);
  *(void **)resolver_3.m_d.d = local_338._M_unused._M_object;
  if ((PromiseData<double> *)local_338._M_unused._0_8_ != (PromiseData<double> *)0x0) {
    LOCK();
    *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
    UNLOCK();
  }
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_338);
  lock_3.q_val = (quintptr)
                 &((QVar11.d)->
                  super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                  ).m_lock;
  QWriteLocker::relock(&lock_3);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)QThread::currentThread();
  std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>::
  pair<QThread_*,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>,_true>
            ((pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
              *)&local_338,(QThread **)&p,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver_3);
  QList<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>::
  emplaceBack<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
            ((QList<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
              *)&((QVar11.d)->
                 super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                 ).m_catchers,
             (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
              *)&local_338);
  std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>::~pair
            ((pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
              *)&local_338);
  QWriteLocker::~QWriteLocker(&lock_3);
  std::_Function_base::~_Function_base((_Function_base *)&resolver_3);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1e8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)&value_1
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1f0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_8.m_d);
  QVar11 = p_5.super_QPromiseBase<(anonymous_namespace)::Bar>.m_d;
  local_230.d = (Data *)local_1f8;
  bVar15 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>::
           isPending(&(p_5.super_QPromiseBase<(anonymous_namespace)::Bar>.m_d.d)->
                      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                    );
  if (!bVar15) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>::dispatch
              (&(QVar11.d)->
                super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              );
  }
  QtPromise::QPromiseBase<void>::wait((QPromiseBase<void> *)&local_338,&local_230);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_338);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_230);
  cVar14 = QTest::compare_helper
                     (value_2.m_bar == 0x2a,"Compared values are not the same",(char *)0x0,
                      (char *)0x0,"waitForValue(p, Bar{})","Bar{42}",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                      ,0x83);
  if (cVar14 == '\0') {
    QtPromise::QPromiseBase<(anonymous_namespace)::Bar>::~QPromiseBase
              (&p_5.super_QPromiseBase<(anonymous_namespace)::Bar>);
    return;
  }
  bVar15 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>::
           isPending(&(QVar11.d)->
                      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                    );
  if (bVar15) {
    bVar15 = false;
  }
  else {
    bVar15 = QtPromisePrivate::PromiseError::isNull
                       (&((QVar11.d)->
                         super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                         ).m_error);
  }
  cVar14 = QTest::qVerify(bVar15,"p.isFulfilled()","",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                          ,0x84);
  QtPromise::QPromiseBase<(anonymous_namespace)::Bar>::~QPromiseBase
            (&p_5.super_QPromiseBase<(anonymous_namespace)::Bar>);
  if (cVar14 == '\0') {
    return;
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(p.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,0x2a);
  QtPromise::resolve<int>((QtPromise *)&local_338,(int *)&p);
  QtPromise::QPromise<int>::convert<QString>((QPromise<int> *)&p_6);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_338);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  waitForValue<QString>((QString *)&local_338,&p_6,(QString *)&p);
  QString::QString((QString *)local_2f8,"42");
  bVar15 = QTest::qCompare((QString *)&local_338,(QString *)local_2f8,"waitForValue(p, QString{})",
                           "QString{\"42\"}",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x8d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_2f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_338);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p);
  if (bVar15) {
    bVar15 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isFulfilled
                       (&(p_6.super_QPromiseBase<QString>.m_d.d)->
                         super_PromiseDataBase<QString,_void_(const_QString_&)>);
    cVar14 = QTest::qVerify(bVar15,"p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x8e);
    QtPromise::QPromiseBase<QString>::~QPromiseBase(&p_6.super_QPromiseBase<QString>);
    if (cVar14 == '\0') {
      return;
    }
    local_fc.m_foo = 0x2a;
    QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&local_230,&local_fc);
    local_2f8._0_8_ = (Data *)0x0;
    local_2f8._8_8_ = (PromiseData<(anonymous_namespace)::Bar> *)0x0;
    local_2e0 = std::
                _Function_handler<QString_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:580:16)>
                ::_M_invoke;
    local_2e8 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                 *)std::
                   _Function_handler<QString_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:580:16)>
                   ::_M_manager;
    p_5.super_QPromiseBase<(anonymous_namespace)::Bar>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00148170;
    pPVar17 = (PromiseData<(anonymous_namespace)::Bar> *)operator_new(0x68);
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar17->
      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
    ->m_error).m_data._M_exception_object = (void *)0x0;
    ((__shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2> *)
    &(pPVar17->m_value).m_data.
     super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>)->_M_ptr =
         (element_type *)0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar17->
      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
    ->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar17->
      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
    ->m_catchers).d.size = 0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar17->
      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
    ->m_handlers).d.size = 0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar17->
      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
    ->m_catchers).d.d = (Data *)0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar17->
      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
    ->m_handlers).d.d = (Data *)0x0;
    (((PromiseDataBase<QString,_void_(const_QString_&)> *)
     &pPVar17->
      super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
    ->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
    *(undefined8 *)
     &((PromiseDataBase<QString,_void_(const_QString_&)> *)
      &pPVar17->
       super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
      ->m_lock = 0;
    *(undefined8 *)
     &((PromiseDataBase<QString,_void_(const_QString_&)> *)
      &pPVar17->
       super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
      ->m_settled = 0;
    ((PromiseDataBase<QString,_void_(const_QString_&)> *)
    &pPVar17->
     super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)->
    _vptr_PromiseDataBase = (_func_int **)0x0;
    *(undefined8 *)
     &((PromiseDataBase<QString,_void_(const_QString_&)> *)
      &pPVar17->
       super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>)
      ->super_QSharedData = 0;
    (((__shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2> *)
     &(pPVar17->m_value).m_data.
      super___shared_ptr<(anonymous_namespace)::Bar,_(__gnu_cxx::_Lock_policy)2>)->_M_refcount).
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<QString>::PromiseData((PromiseData<QString> *)pPVar17);
    LOCK();
    pQVar1 = &((PromiseDataBase<QString,_void_(const_QString_&)> *)
              &pPVar17->
               super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
              )->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar17 != (PromiseData<(anonymous_namespace)::Bar> *)0x0) {
      LOCK();
      pQVar1 = &((PromiseDataBase<QString,_void_(const_QString_&)> *)
                &pPVar17->
                 super_PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
                )->super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    p_6.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001486c8;
    p_5.super_QPromiseBase<(anonymous_namespace)::Bar>.m_d.d = pPVar17;
    p_6.super_QPromiseBase<QString>.m_d.d = (PromiseData<QString> *)pPVar17;
    QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
              ((PromiseResolver<QString> *)&value_1,&p_6);
    QtPromise::QPromiseBase<QString>::~QPromiseBase(&p_6.super_QPromiseBase<QString>);
    pcVar12 = local_230.ptr;
    if ((PromiseData<double> *)_value_1 == (PromiseData<double> *)0x0) {
      local_338._M_unused._M_object = (PromiseData<double> *)0x0;
    }
    else {
      LOCK();
      (((QAtomicInt *)
       &((PromiseDataBase<double,_void_(const_double_&)> *)&_value_1->super_QSharedData)->
        _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (((QAtomicInt *)
            &((PromiseDataBase<double,_void_(const_double_&)> *)&_value_1->super_QSharedData)->
             _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_338._M_unused._0_8_ = (undefined8)_value_1;
    }
    local_1e0.d = (Data *)0x0;
    if ((PromiseData<double> *)local_338._M_unused._0_8_ == (PromiseData<double> *)0x0) {
      local_338._8_8_ = (PromiseData<double> *)0x0;
    }
    else {
      LOCK();
      (((QAtomicInt *)
       &(((PromiseData<double> *)local_338._M_unused._0_8_)->
        super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
      super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i = (((QAtomicInt *)
              &(((PromiseData<double> *)local_338._M_unused._0_8_)->
               super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
             super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_338._8_8_ = local_338._M_unused._M_function_pointer;
    }
    _value_2 = (Data *)0x0;
    if ((PromiseData<double> *)local_338._M_unused._0_8_ != (PromiseData<double> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &(((PromiseData<double> *)local_338._M_unused._0_8_)->
        super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
      super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i = (((QAtomicInt *)
              &(((PromiseData<double> *)local_338._M_unused._0_8_)->
               super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
             super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &(((PromiseData<double> *)local_338._8_8_)->
        super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
      super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i = (((QAtomicInt *)
              &(((PromiseData<double> *)local_338._8_8_)->
               super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase)->
             super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1f0.d = (Data *)local_338._M_unused._0_8_;
    local_1e8.d = (Data *)local_338._8_8_;
    std::function<QString_(const_(anonymous_namespace)::Foo_&)>::function
              ((function<QString_(const_(anonymous_namespace)::Foo_&)> *)local_328,
               (function<QString_(const_(anonymous_namespace)::Foo_&)> *)local_2f8);
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    pp_Var27 = (_func_int **)operator_new(0x30);
    *pp_Var27 = (_func_int *)local_338._M_unused._0_8_;
    if ((PromiseData<double> *)local_338._M_unused._0_8_ != (PromiseData<double> *)0x0) {
      LOCK();
      *(int *)local_338._M_unused._0_8_ = *local_338._M_unused._M_object + 1;
      UNLOCK();
    }
    pp_Var27[1] = (_func_int *)local_338._8_8_;
    if ((PromiseData<double> *)local_338._8_8_ != (PromiseData<double> *)0x0) {
      LOCK();
      *(int *)local_338._8_8_ = *(int *)local_338._8_8_ + 1;
      UNLOCK();
    }
    std::function<QString_(const_(anonymous_namespace)::Foo_&)>::function
              ((function<QString_(const_(anonymous_namespace)::Foo_&)> *)(pp_Var27 + 2),
               (function<QString_(const_(anonymous_namespace)::Foo_&)> *)local_328);
    p.super_QPromiseBase<int>._vptr_QPromiseBase = pp_Var27;
    QtPromisePrivate::
    PromiseHandler<(anonymous_namespace)::Foo,std::function<QString((anonymous_namespace)::Foo_const&)>,(anonymous_namespace)::Foo_const&>
    ::
    create<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(std::function<QString((anonymous_namespace)::Foo_const&)>const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)
    ::{lambda((anonymous_namespace)::Foo_const&)#1}::~create
              ((_lambda__anonymous_namespace___Foo_const___1_ *)&local_338);
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
    addHandler((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                *)pcVar12,(function<void_(const_(anonymous_namespace)::Foo_&)> *)&p);
    std::_Function_base::~_Function_base((_Function_base *)&p);
    pcVar12 = local_230.ptr;
    resolver_8.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)local_1e8.d;
    if (local_1e8.d != (Data *)0x0) {
      LOCK();
      ((local_1e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_1e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_328._0_8_ = (void *)0x0;
    local_328._8_8_ = 0;
    local_338._M_unused._M_object = (Data *)0x0;
    local_338._8_8_ = (PromiseData<double> *)0x0;
    local_338._M_unused._M_object = operator_new(8);
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
     &(((PromiseData<double> *)local_338._M_unused._0_8_)->
      super_PromiseDataBase<double,_void_(const_double_&)>)._vptr_PromiseDataBase = resolver_8.m_d.d
    ;
    if (resolver_8.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
      UNLOCK();
    }
    local_328._8_8_ =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
         ::_M_invoke;
    local_328._0_8_ =
         std::
         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
         ::_M_manager;
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
               &resolver_8);
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
    addCatcher((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                *)pcVar12,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_338);
    std::_Function_base::~_Function_base((_Function_base *)&local_338);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_1e8);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
               &value_2);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_1f0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_1e0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
               &value_1);
    pcVar12 = local_230.ptr;
    p_5.super_QPromiseBase<(anonymous_namespace)::Bar>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_001486c8;
    bVar15 = QtPromisePrivate::
             PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
             ::isPending((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                          *)local_230.ptr);
    if (!bVar15) {
      QtPromisePrivate::
      PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
      dispatch((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                *)pcVar12);
    }
    std::_Function_base::~_Function_base((_Function_base *)local_2f8);
    QtPromise::QPromiseBase<(anonymous_namespace)::Foo>::~QPromiseBase
              ((QPromiseBase<(anonymous_namespace)::Foo> *)&local_230);
    p_6.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)0x0;
    p_6.super_QPromiseBase<QString>.m_d.d = (PromiseData<QString> *)0x0;
    waitForValue<QString>((QString *)local_2f8,(QPromise<QString> *)&p_5,(QString *)&p_6);
    QString::QString((QString *)&local_230,"Foo{42}");
    bVar15 = QTest::qCompare((QString *)local_2f8,(QString *)&local_230,"waitForValue(p, QString{})"
                             ,"QString{\"Foo{42}\"}",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                             ,0x98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_230);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_2f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&p_6);
    if (bVar15) {
      bVar15 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isFulfilled
                         ((PromiseDataBase<QString,_void_(const_QString_&)> *)
                          p_5.super_QPromiseBase<(anonymous_namespace)::Bar>.m_d.d);
      QTest::qVerify(bVar15,"p.isFulfilled()","",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                     ,0x99);
    }
    this_03 = (QPromiseBase<QString> *)&p_5;
  }
  else {
    this_03 = &p_6.super_QPromiseBase<QString>;
  }
LAB_0010a3af:
  QtPromise::QPromiseBase<QString>::~QPromiseBase(this_03);
  return;
}

Assistant:

void tst_qpromise_convert::fulfillTAsU()
{
    // Static cast between primitive types.
    {
        auto p = QtPromise::resolve(42.13).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QCOMPARE(waitForValue(p, -1), 42);
        QVERIFY(p.isFulfilled());
    }

    // Convert enum class to int.
    {
        auto p = QtPromise::resolve(Enum1::Value1).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QCOMPARE(waitForValue(p, -1), 1);
        QVERIFY(p.isFulfilled());
    }

    // Convert int to enum class.
    {
        auto p = QtPromise::resolve(1).convert<Enum1>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Enum1>>::value));

        QCOMPARE(waitForValue(p, Enum1::Value0), Enum1::Value1);
        QVERIFY(p.isFulfilled());
    }

    // Convert between enums
    {
        auto p = QtPromise::resolve(Enum1::Value1).convert<Enum2>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Enum2>>::value));

        QCOMPARE(waitForValue(p, Enum2::Value0), Enum2::Value1);
        QVERIFY(p.isFulfilled());
    }

    // Converting constructor for Qt types.
    // https://en.cppreference.com/w/cpp/language/converting_constructor
    {
        auto p = QtPromise::resolve(QByteArray{"foo"}).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"foo"});
        QVERIFY(p.isFulfilled());
    }

    // Converting constructor for non-Qt types.
    // https://en.cppreference.com/w/cpp/language/converting_constructor
    {
        auto p = QtPromise::resolve(Foo{42}).convert<Bar>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Bar>>::value));

        QCOMPARE(waitForValue(p, Bar{}), Bar{42});
        QVERIFY(p.isFulfilled());
    }

    // Conversion of types Qt is aware of via QVariant.
    {
        auto p = QtPromise::resolve(42).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"42"});
        QVERIFY(p.isFulfilled());
    }

    // Conversion of a non-Qt type via QVariant.
    // https://doc.qt.io/qt-5/qmetatype.html#registerConverter
    {
        auto p = QtPromise::resolve(Foo{42}).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"Foo{42}"});
        QVERIFY(p.isFulfilled());
    }
}